

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::UnpackSnorm2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackSnorm2x16CaseInstance *this)

{
  ShaderExecutor *pSVar1;
  float fVar2;
  float fVar3;
  deUint32 dVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  int iVar8;
  TestStatus *pTVar9;
  int iVar10;
  Hex<8UL> hex;
  long lVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  uint uVar16;
  float fVar18;
  undefined1 auVar17 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  void *out;
  HexFloat local_21c;
  HexFloat local_218;
  HexFloat local_214;
  TestStatus *local_210;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  Random rnd;
  void *in;
  ostringstream local_1a8 [376];
  
  dVar4 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar4 ^ 0x776002);
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in = (void *)((ulong)in._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x7fff8000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x80007fff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0xffffffff);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  in = (void *)CONCAT44(in._4_4_,0x1fffe);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,(uint *)&in);
  iVar10 = 0x5f;
  while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    in = (void *)CONCAT44(in._4_4_,dVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&inputs,(uint *)&in);
  }
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&outputs,(long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Executing shader for ");
  local_210 = __return_storage_ptr__;
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  in = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  iVar10 = 0;
  (*pSVar1->_vptr_ShaderExecutor[2])
            (pSVar1,(ulong)((long)inputs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,&in,&out,0);
  uVar7 = (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  puVar5 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar11 = 0; lVar11 < (int)((ulong)((long)puVar6 - (long)puVar5) >> 2); lVar11 = lVar11 + 1) {
    auVar15 = pshuflw(ZEXT416(puVar5[lVar11]),ZEXT416(puVar5[lVar11]),0x60);
    auVar17._0_4_ = (float)(auVar15._0_4_ >> 0x10);
    auVar17._4_4_ = (float)(auVar15._4_4_ >> 0x10);
    auVar17._8_4_ = (float)(auVar15._8_4_ >> 0x10);
    auVar17._12_4_ = (float)(auVar15._12_4_ >> 0x10);
    auVar17 = divps(auVar17,ZEXT816(0x46fffe0046fffe00));
    auVar15 = minps(ZEXT816(0x3f8000003f800000),auVar17);
    uVar13 = -(uint)(auVar17._0_4_ < -1.0);
    uVar14 = -(uint)(auVar17._4_4_ < -1.0);
    uVar16 = ~uVar13 & auVar15._0_4_ | uVar13 & 0xbf800000;
    fVar18 = (float)(~uVar14 & auVar15._4_4_ | uVar14 & 0xbf800000);
    fVar2 = outputs.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar11].m_data[0];
    fVar3 = outputs.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar11].m_data[1];
    uVar13 = -(uint)((int)-fVar2 < (int)(uVar16 ^ 0x80000000));
    if (1 < (-(uint)((int)-fVar3 < (int)-fVar18) -
             ((int)fVar18 - (int)fVar3 ^ -(uint)((int)-fVar3 < (int)-fVar18)) |
            uVar13 - (uVar16 - (int)fVar2 ^ uVar13))) {
      if (iVar10 < 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ERROR: Mismatch in value ");
        std::ostream::operator<<(local_1a8,(int)lVar11);
        std::operator<<((ostream *)local_1a8,",\n");
        std::operator<<((ostream *)local_1a8,"  expected unpackSnorm2x16(");
        hex.value._4_4_ = 0;
        hex.value._0_4_ =
             inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
        tcu::Format::operator<<((ostream *)local_1a8,hex);
        std::operator<<((ostream *)local_1a8,") = ");
        std::operator<<((ostream *)local_1a8,"vec2(");
        out = (void *)CONCAT44(out._4_4_,uVar16);
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,(HexFloat *)&out);
        std::operator<<((ostream *)local_1a8,", ");
        local_214.value = fVar18;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_214);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,", got vec2(");
        local_218.value = fVar2;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_218);
        std::operator<<((ostream *)local_1a8,", ");
        local_21c.value = fVar3;
        tcu::MessageBuilder::operator<<((MessageBuilder *)&in,&local_21c);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,"\n  ULP diffs = (");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8,"), max diff = ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      else if (iVar10 == 10) {
        in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      iVar10 = iVar10 + 1;
      puVar5 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  in = ((this->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar8 = (int)(uVar7 >> 2);
  std::ostream::operator<<(local_1a8,iVar8 - iVar10);
  std::operator<<((ostream *)local_1a8," / ");
  std::ostream::operator<<(local_1a8,iVar8);
  std::operator<<((ostream *)local_1a8," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if (iVar10 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&in,"Pass",(allocator<char> *)&out)
    ;
    pTVar9 = local_210;
    tcu::TestStatus::pass(local_210,(string *)&in);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in,"Result comparison failed",(allocator<char> *)&out);
    pTVar9 = local_210;
    tcu::TestStatus::fail(local_210,(string *)&in);
  }
  std::__cxx11::string::~string((string *)&in);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return pTVar9;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt16	in0			= (deInt16)(deUint16)(inputs[valNdx] & 0xffff);
				const deInt16	in1			= (deInt16)(deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= de::clamp(float(in0) / 32767.f, -1.0f, 1.0f);
				const float		ref1		= de::clamp(float(in1) / 32767.f, -1.0f, 1.0f);
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ")"
															   << ", got vec2(" << HexFloat(res0) << ", " << HexFloat(res1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}